

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  sysbvm_tuple_t chainedMessage;
  bool hasReceiver_00;
  size_t local_a8;
  size_t i;
  size_t chainedMessageCount;
  undefined1 auStack_90 [7];
  _Bool hasReceiver;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_13565e4c gcFrame;
  sysbvm_astMessageChainNode_t **chainNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x18);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_90 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_90);
  hasReceiver_00 = *(long *)(*arguments + 0x28) != 0;
  if (hasReceiver_00) {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  }
  sVar1 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x38));
  for (local_a8 = 0; local_a8 < sVar1; local_a8 = local_a8 + 1) {
    chainedMessage = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x38),local_a8);
    gcFrame.chainedMessage =
         sysbvm_astMessageChainMessageNode_evaluate
                   (context,chainedMessage,hasReceiver_00,(sysbvm_tuple_t *)&gcFrameRecord.roots,
                    arguments + 1);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_90);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.chainedMessage;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageChainNode_t **chainNode = (sysbvm_astMessageChainNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t chainedMessage;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*chainNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*chainNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*chainNode)->receiver, *environment);
        hasReceiver = true;
    }

    size_t chainedMessageCount = sysbvm_array_getSize((*chainNode)->messages);
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessage = sysbvm_array_at((*chainNode)->messages, i);
        gcFrame.result = sysbvm_astMessageChainMessageNode_evaluate(context, gcFrame.chainedMessage, hasReceiver, &gcFrame.receiver, environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}